

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O3

void Dtt_ProcessType(int *Type,int nFanin)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = *Type;
  if (nFanin == 3) {
    uVar2 = iVar1 + 5;
    if (4 < iVar1) {
      uVar2 = iVar1 - 5;
    }
  }
  else if ((iVar1 == 5) || (iVar1 == 0)) {
    uVar2 = iVar1 + nFanin;
  }
  else {
    uVar2 = 0;
    if (iVar1 != nFanin) {
      uVar2 = 8;
      if (iVar1 + nFanin != 3) {
        if (iVar1 == 4) {
          uVar2 = 9;
        }
        else if (iVar1 == 3) {
          uVar2 = nFanin == 1 | 6;
        }
        else {
          uVar2 = 5;
          if (((iVar1 != nFanin + 5) && (uVar2 = 3, iVar1 + nFanin != 8)) && (uVar2 = 4, iVar1 != 9)
             ) {
            if (iVar1 != 8) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                            ,0x357,"void Dtt_ProcessType(int *, int)");
            }
            uVar2 = (nFanin == 1) + 1;
          }
        }
      }
    }
  }
  *Type = uVar2;
  return;
}

Assistant:

void Dtt_ProcessType( int* Type, int nFanin )
{
    // 0: 1&2, 1: ~1&2, 2: 1&~2, 3: 1|2 = ~(~1&~2), 4: 1^2
    // 5: ~(1&2), 6: ~(~1&2), 7: ~(1&~2), 8: ~1&~2, 9: ~(1^2)
    if ( nFanin == 3 ) // for output negation
        *Type += (*Type<5)? 5: -5;
    else if ( *Type == 0 || *Type == 5 )
        *Type += nFanin;
    else if ( *Type == nFanin ) // 1,1 ; 2,2
        *Type = 0;
    else if ( *Type + nFanin == 3 ) // 1,2 ; 2,1
        *Type = 8;
    else if ( *Type == 3 )
        *Type = (nFanin==1)? 7: 6;
    else if ( *Type == 4 )
        *Type = 9;
    else if ( *Type == nFanin+5 ) // 6,1 ; 7,2
        *Type = 5;
    else if ( *Type + nFanin == 8 ) // 6,2 ; 7,1
        *Type = 3;
    else if ( *Type == 8 )
        *Type = (nFanin==1)? 2: 1;
    else if ( *Type == 9 )
        *Type = 4;
    else
        assert( 0 );
}